

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protocol.c
# Opt level: O2

objc_property_t *
protocol_copyPropertyList2
          (Protocol *p,uint *outCount,BOOL isRequiredProperty,BOOL isInstanceProperty)

{
  objc_property_list *l;
  objc_property_list *poVar1;
  objc_property_t *ppoVar2;
  objc_property *poVar3;
  undefined7 in_register_00000009;
  undefined3 in_register_00000011;
  uint uVar4;
  int i;
  int i_00;
  uint uVar5;
  objc_property_list *l_1;
  objc_property_list *l_00;
  
  if (p != (Protocol *)0x0) {
    l_00 = *(objc_property_list **)
            ((long)&p->properties +
            (ulong)((uint)((int)CONCAT71(in_register_00000009,isInstanceProperty) == 0) * 0x10 +
                   (uint)(CONCAT31(in_register_00000011,isRequiredProperty) == 0) * 8));
    if (isRequiredProperty == '\0' && isInstanceProperty == '\0') {
      if ((objc_class *)p->isa == &_OBJC_CLASS_ProtocolGCC) {
        return (objc_property_t *)0x0;
      }
      if (l_00 == (objc_property_list *)0x0) {
        return (objc_property_t *)0x0;
      }
    }
    else if (l_00 == (objc_property_list *)0x0) {
      return (objc_property_t *)0x0;
    }
    uVar4 = 0;
    for (poVar1 = l_00; poVar1 != (objc_property_list *)0x0; poVar1 = poVar1->next) {
      uVar4 = uVar4 + poVar1->count;
    }
    if (uVar4 != 0) {
      ppoVar2 = (objc_property_t *)calloc(8,(ulong)uVar4);
      uVar5 = 0;
      for (; l_00 != (objc_property_list *)0x0; l_00 = l_00->next) {
        for (i_00 = 0; i_00 < l_00->count; i_00 = i_00 + 1) {
          poVar3 = property_at_index(l_00,i_00);
          ppoVar2[i_00 + uVar5] = poVar3;
        }
        uVar5 = i_00 + uVar5;
      }
      *outCount = uVar4;
      return ppoVar2;
    }
  }
  return (objc_property_t *)0x0;
}

Assistant:

objc_property_t *protocol_copyPropertyList2(Protocol *p, unsigned int *outCount,
		BOOL isRequiredProperty, BOOL isInstanceProperty)
{
	struct objc_property_list *properties =
	    isInstanceProperty ?
	        (isRequiredProperty ? p->properties : p->optional_properties) :
	        (isRequiredProperty ? p->class_properties : p->optional_class_properties);
	if (NULL == p) { return NULL; }
	// If it's an old protocol, it won't have any of the other options.
	if (!isRequiredProperty && !isInstanceProperty &&
	    !protocol_hasOptionalMethodsAndProperties(p))
	{
		return NULL;
	}
	if (properties == NULL)
	{
		return NULL;
	}
	unsigned int count = 0;
	for (struct objc_property_list *l=properties ; l!=NULL ; l=l->next)
	{
		count += l->count;
	}
	if (0 == count)
	{
		return NULL;
	}
	objc_property_t *list = calloc(sizeof(objc_property_t), count);
	unsigned int out = 0;
	for (struct objc_property_list *l=properties ; l!=NULL ; l=l->next)
	{
		for (int i=0 ; i<l->count ; i++)
		{
			list[out++] = property_at_index(l, i);
		}
	}
	*outCount = count;
	return list;
}